

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O1

bool __thiscall
xercesc_4_0::DTDScanner::scanEntityDef(DTDScanner *this,DTDEntityDecl *decl,bool isPEDecl)

{
  short *psVar1;
  XMLBufferMgr *pXVar2;
  MemoryManager *pMVar3;
  XMLBufferMgr *this_00;
  XMLBufferMgr *this_01;
  ReaderMgr *pRVar4;
  bool bVar5;
  bool bVar6;
  XMLCh XVar7;
  int iVar8;
  undefined4 extraout_var;
  long lVar9;
  XMLSize_t XVar10;
  XMLBuffer *pubIdToFill;
  XMLBuffer *sysIdToFill;
  XMLCh *pXVar11;
  XMLCh *pXVar12;
  undefined4 extraout_var_02;
  XMLBuffer *toFill;
  undefined4 extraout_var_03;
  size_t sVar13;
  XMLCh *__src;
  XMLBufBid bbPubId;
  XMLBufBid bbName;
  XMLBufBid bbSysId;
  LastExtEntityInfo lastInfo;
  LastExtEntityInfo local_50;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  XVar7 = ReaderMgr::peekNextChar(this->fReaderMgr);
  if ((XVar7 != L'\'') && (XVar7 = ReaderMgr::peekNextChar(this->fReaderMgr), XVar7 != L'\"')) {
    pXVar2 = this->fBufMgr;
    pubIdToFill = XMLBufferMgr::bidOnBuffer(pXVar2);
    this_00 = this->fBufMgr;
    sysIdToFill = XMLBufferMgr::bidOnBuffer(this_00);
    bVar5 = scanId(this,pubIdToFill,sysIdToFill,IDType_External);
    if (bVar5) {
      (decl->super_XMLEntityDecl).fIsExternal = true;
      ReaderMgr::getLastExtEntityInfo(this->fReaderMgr,&local_50);
      pXVar11 = pubIdToFill->fBuffer;
      pXVar11[pubIdToFill->fIndex] = L'\0';
      pXVar12 = sysIdToFill->fBuffer;
      pXVar12[sysIdToFill->fIndex] = L'\0';
      __src = (XMLCh *)0x0;
      if ((pXVar11 != (XMLCh *)0x0) && (__src = (XMLCh *)0x0, *pXVar11 != L'\0')) {
        __src = pXVar11;
      }
      if ((decl->super_XMLEntityDecl).fPublicId != (XMLCh *)0x0) {
        (*((decl->super_XMLEntityDecl).fMemoryManager)->_vptr_MemoryManager[4])();
      }
      if (__src == (XMLCh *)0x0) {
        pXVar11 = (XMLCh *)0x0;
      }
      else {
        pMVar3 = (decl->super_XMLEntityDecl).fMemoryManager;
        sVar13 = 0;
        do {
          psVar1 = (short *)((long)__src + sVar13);
          sVar13 = sVar13 + 2;
        } while (*psVar1 != 0);
        iVar8 = (*pMVar3->_vptr_MemoryManager[3])(pMVar3,sVar13);
        pXVar11 = (XMLCh *)CONCAT44(extraout_var_00,iVar8);
        memcpy(pXVar11,__src,sVar13);
      }
      (decl->super_XMLEntityDecl).fPublicId = pXVar11;
      pXVar11 = (XMLCh *)0x0;
      if ((pXVar12 != (XMLCh *)0x0) && (*pXVar12 != L'\0')) {
        pXVar11 = pXVar12;
      }
      if ((decl->super_XMLEntityDecl).fSystemId != (XMLCh *)0x0) {
        (*((decl->super_XMLEntityDecl).fMemoryManager)->_vptr_MemoryManager[4])();
      }
      if (pXVar11 == (XMLCh *)0x0) {
        pXVar12 = (XMLCh *)0x0;
      }
      else {
        pMVar3 = (decl->super_XMLEntityDecl).fMemoryManager;
        sVar13 = 0;
        do {
          psVar1 = (short *)((long)pXVar11 + sVar13);
          sVar13 = sVar13 + 2;
        } while (*psVar1 != 0);
        iVar8 = (*pMVar3->_vptr_MemoryManager[3])(pMVar3,sVar13);
        pXVar12 = (XMLCh *)CONCAT44(extraout_var_01,iVar8);
        memcpy(pXVar12,pXVar11,sVar13);
      }
      (decl->super_XMLEntityDecl).fSystemId = pXVar12;
      pXVar11 = (XMLCh *)0x0;
      if ((local_50.systemId != (XMLCh *)0x0) && (*local_50.systemId != L'\0')) {
        pXVar11 = local_50.systemId;
      }
      if ((decl->super_XMLEntityDecl).fBaseURI != (XMLCh *)0x0) {
        (*((decl->super_XMLEntityDecl).fMemoryManager)->_vptr_MemoryManager[4])();
      }
      if (pXVar11 == (XMLCh *)0x0) {
        pXVar12 = (XMLCh *)0x0;
      }
      else {
        pMVar3 = (decl->super_XMLEntityDecl).fMemoryManager;
        sVar13 = 0;
        do {
          psVar1 = (short *)((long)pXVar11 + sVar13);
          sVar13 = sVar13 + 2;
        } while (*psVar1 != 0);
        iVar8 = (*pMVar3->_vptr_MemoryManager[3])(pMVar3,sVar13);
        pXVar12 = (XMLCh *)CONCAT44(extraout_var_02,iVar8);
        memcpy(pXVar12,pXVar11,sVar13);
      }
      (decl->super_XMLEntityDecl).fBaseURI = pXVar12;
      bVar6 = checkForPERef(this,false,true);
      if (isPEDecl) {
        bVar5 = true;
        if (!bVar6) goto LAB_0030d780;
        bVar5 = XMLReader::skippedString
                          (this->fReaderMgr->fCurReader,(XMLCh *)XMLUni::fgNDATAString);
        if (bVar5) {
          XMLScanner::emitError(this->fScanner,NDATANotValidForPE);
        }
      }
      XVar7 = ReaderMgr::peekNextChar(this->fReaderMgr);
      bVar5 = true;
      if (XVar7 != L'>') {
        if (!bVar6) {
          XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
        }
        bVar5 = XMLReader::skippedString
                          (this->fReaderMgr->fCurReader,(XMLCh *)XMLUni::fgNDATAString);
        if (!bVar5) {
          XMLScanner::emitError(this->fScanner,ExpectedNDATA);
        }
        bVar5 = checkForPERef(this,false,true);
        if (!bVar5) {
          XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
        }
        this_01 = this->fBufMgr;
        toFill = XMLBufferMgr::bidOnBuffer(this_01);
        pRVar4 = this->fReaderMgr;
        toFill->fIndex = 0;
        bVar5 = XMLReader::getName(pRVar4->fCurReader,toFill,false);
        if (bVar5) {
          pXVar11 = toFill->fBuffer;
          pXVar11[toFill->fIndex] = L'\0';
          if ((decl->super_XMLEntityDecl).fNotationName != (XMLCh *)0x0) {
            (*((decl->super_XMLEntityDecl).fMemoryManager)->_vptr_MemoryManager[4])();
          }
          if (pXVar11 == (XMLCh *)0x0) {
            pXVar12 = (XMLCh *)0x0;
          }
          else {
            pMVar3 = (decl->super_XMLEntityDecl).fMemoryManager;
            sVar13 = 0;
            do {
              psVar1 = (short *)((long)pXVar11 + sVar13);
              sVar13 = sVar13 + 2;
            } while (*psVar1 != 0);
            iVar8 = (*pMVar3->_vptr_MemoryManager[3])(pMVar3,sVar13);
            pXVar12 = (XMLCh *)CONCAT44(extraout_var_03,iVar8);
            memcpy(pXVar12,pXVar11,sVar13);
          }
          (decl->super_XMLEntityDecl).fNotationName = pXVar12;
        }
        else {
          XMLScanner::emitError(this->fScanner,ExpectedNotationName);
        }
        XMLBufferMgr::releaseBuffer(this_01,toFill);
      }
    }
    else {
      bVar5 = false;
    }
LAB_0030d780:
    XMLBufferMgr::releaseBuffer(this_00,sysIdToFill);
    XMLBufferMgr::releaseBuffer(pXVar2,pubIdToFill);
    return bVar5;
  }
  pXVar2 = this->fBufMgr;
  local_50.systemId = (XMLCh *)XMLBufferMgr::bidOnBuffer(pXVar2);
  local_50.publicId = (XMLCh *)pXVar2;
  bVar5 = scanEntityLiteral(this,(XMLBuffer *)local_50.systemId);
  if (!bVar5) goto LAB_0030d52a;
  pXVar11 = *(XMLCh **)((long)local_50.systemId + 0x30);
  pXVar11[*(XMLSize_t *)local_50.systemId] = L'\0';
  if ((decl->super_XMLEntityDecl).fValue != (XMLCh *)0x0) {
    (*((decl->super_XMLEntityDecl).fMemoryManager)->_vptr_MemoryManager[4])();
  }
  if (pXVar11 == (XMLCh *)0x0) {
    (decl->super_XMLEntityDecl).fValue = (XMLCh *)0x0;
LAB_0030d524:
    XVar10 = 0;
  }
  else {
    pMVar3 = (decl->super_XMLEntityDecl).fMemoryManager;
    sVar13 = 0;
    do {
      psVar1 = (short *)((long)pXVar11 + sVar13);
      sVar13 = sVar13 + 2;
    } while (*psVar1 != 0);
    iVar8 = (*pMVar3->_vptr_MemoryManager[3])(pMVar3,sVar13);
    memcpy((XMLCh *)CONCAT44(extraout_var,iVar8),pXVar11,sVar13);
    (decl->super_XMLEntityDecl).fValue = (XMLCh *)CONCAT44(extraout_var,iVar8);
    if (pXVar11 == (XMLCh *)0x0) goto LAB_0030d524;
    lVar9 = 0;
    do {
      psVar1 = (short *)((long)pXVar11 + lVar9);
      lVar9 = lVar9 + 2;
    } while (*psVar1 != 0);
    XVar10 = (lVar9 >> 1) - 1;
  }
  (decl->super_XMLEntityDecl).fValueLen = XVar10;
LAB_0030d52a:
  XMLBufferMgr::releaseBuffer((XMLBufferMgr *)local_50.publicId,(XMLBuffer *)local_50.systemId);
  return bVar5;
}

Assistant:

bool DTDScanner::scanEntityDef(DTDEntityDecl& decl, const bool isPEDecl)
{
    // Its got to be an entity literal
    if (fReaderMgr->lookingAtChar(chSingleQuote)
    ||  fReaderMgr->lookingAtChar(chDoubleQuote))
    {
        // Get a buffer for the literal
        XMLBufBid bbValue(fBufMgr);

        if (!scanEntityLiteral(bbValue.getBuffer()))
            return false;

        // Set it on the entity decl
        decl.setValue(bbValue.getRawBuffer());
        return true;
    }

    //
    //  Its got to be an external entity, so there must be an external id.
    //  Get buffers for them and scan an external id into them.
    //
    XMLBufBid bbPubId(fBufMgr);
    XMLBufBid bbSysId(fBufMgr);
    if (!scanId(bbPubId.getBuffer(), bbSysId.getBuffer(), IDType_External))
        return false;

    decl.setIsExternal(true);
    ReaderMgr::LastExtEntityInfo lastInfo;
    fReaderMgr->getLastExtEntityInfo(lastInfo);

    // Fill in the id fields of the decl with the info we got
    const XMLCh* publicId = bbPubId.getRawBuffer();
    const XMLCh* systemId = bbSysId.getRawBuffer();
    decl.setPublicId((publicId && *publicId) ? publicId : 0);
    decl.setSystemId((systemId && *systemId) ? systemId : 0);
    decl.setBaseURI((lastInfo.systemId && *lastInfo.systemId) ? lastInfo.systemId : 0);

    // If its a PE decl, we are done
    bool gotSpaces = checkForPERef(false, true);
    if (isPEDecl)
    {
        //
        //  Check for a common error here. NDATA is not allowed for PEs
        //  so check for the NDATA string. If found give a nice meaningful
        //  error and continue parsing to eat the NDATA text.
        //
        if (gotSpaces)
        {
            if (fReaderMgr->skippedString(XMLUni::fgNDATAString))
                fScanner->emitError(XMLErrs::NDATANotValidForPE);
        }
         else
        {
            return true;
        }
    }

    // If looking at close angle now, we are done
    if (fReaderMgr->lookingAtChar(chCloseAngle))
        return true;

    // Else we had to have seem the whitespace
    if (!gotSpaces)
        fScanner->emitError(XMLErrs::ExpectedWhitespace);

    // We now have to see a notation data string
    if (!fReaderMgr->skippedString(XMLUni::fgNDATAString))
        fScanner->emitError(XMLErrs::ExpectedNDATA);

    // Space is required here, but try to go on if not
    if (!checkForPERef(false, true))
        fScanner->emitError(XMLErrs::ExpectedWhitespace);

    // Get a name
    XMLBufBid bbName(fBufMgr);
    if (!fReaderMgr->getName(bbName.getBuffer()))
    {
        fScanner->emitError(XMLErrs::ExpectedNotationName);
        return false;
    }

    // Set the decl's notation name
    decl.setNotationName(bbName.getRawBuffer());

    return true;
}